

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O0

HalfedgeHandle __thiscall
OpenMesh::ArrayKernel::new_edge(ArrayKernel *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  int iVar1;
  EdgeHandle _eh;
  BaseHandle _heh;
  HalfedgeHandle _heh_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference _e;
  HalfedgeHandle heh1;
  EdgeHandle eh;
  ArrayKernel *this_local;
  VertexHandle _end_vh_local;
  VertexHandle _start_vh_local;
  HalfedgeHandle heh0;
  
  memset(&stack0xffffffffffffffc0,0,0x20);
  ArrayItems::Edge::Edge((Edge *)&stack0xffffffffffffffc0);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::push_back
            (&this->edges_,(value_type *)&stack0xffffffffffffffc0);
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])();
  BaseKernel::eprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])();
  BaseKernel::hprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var_00,iVar1));
  _e = std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::back
                 (&this->edges_);
  _eh = handle(this,_e);
  _heh.idx_ = (int)halfedge_handle(this,_eh.super_BaseHandle.idx_,0);
  _heh_00 = halfedge_handle(this,(EdgeHandle)_eh.super_BaseHandle.idx_,1);
  set_vertex_handle(this,(HalfedgeHandle)_heh.idx_,_end_vh);
  set_vertex_handle(this,_heh_00,_start_vh);
  return (BaseHandle)(BaseHandle)_heh.idx_;
}

Assistant:

inline HalfedgeHandle new_edge(VertexHandle _start_vh, VertexHandle _end_vh)
  {
//     assert(_start_vh != _end_vh);
    edges_.push_back(Edge());
    eprops_resize(n_edges());//TODO:should it be push_back()?
    hprops_resize(n_halfedges());//TODO:should it be push_back()?

    EdgeHandle eh(handle(edges_.back()));
    HalfedgeHandle heh0(halfedge_handle(eh, 0));
    HalfedgeHandle heh1(halfedge_handle(eh, 1));
    set_vertex_handle(heh0, _end_vh);
    set_vertex_handle(heh1, _start_vh);
    return heh0;
  }